

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::IntegerLiteral::fromSyntax(Compilation *comp,LiteralExpressionSyntax *syntax)

{
  bool bVar1;
  bitwidth_t bVar2;
  LanguageVersion LVar3;
  IntegerLiteral *pIVar4;
  Compilation *in_RDI;
  SourceRange SVar5;
  SVInt val;
  Type *type;
  SVInt *in_stack_ffffffffffffff00;
  Token *in_stack_ffffffffffffff08;
  SVInt *in_stack_ffffffffffffff10;
  SVInt *in_stack_ffffffffffffff18;
  Type *args_4;
  Type *in_stack_ffffffffffffff30;
  Compilation *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  bitwidth_t in_stack_ffffffffffffff44;
  SyntaxNode *in_stack_ffffffffffffff50;
  bitmask<slang::ast::IntegralFlags> local_59 [29];
  bitwidth_t in_stack_ffffffffffffffc4;
  Compilation *in_stack_ffffffffffffffc8;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffd7;
  SyntaxNode local_28;
  Compilation *local_8;
  
  local_8 = in_RDI;
  parsing::Token::intValue(in_stack_ffffffffffffff08);
  bVar2 = SVInt::getBitWidth((SVInt *)&local_28);
  if (0x1f < bVar2) {
    LVar3 = Compilation::languageVersion((Compilation *)0xbaba89);
    if (0 < (int)LVar3) {
      bVar1 = SVInt::isSigned((SVInt *)&local_28);
      if (!bVar1) {
        SVInt::getBitWidth((SVInt *)&local_28);
        SVInt::resize(in_stack_ffffffffffffff18,
                      (bitwidth_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        in_stack_ffffffffffffff50 = &local_28;
        SVInt::operator=((SVInt *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        SVInt::~SVInt(in_stack_ffffffffffffff10);
        SVInt::setSigned((SVInt *)in_stack_ffffffffffffff50,true);
      }
      in_stack_ffffffffffffff38 = local_8;
      in_stack_ffffffffffffff44 = SVInt::getBitWidth((SVInt *)&local_28);
      bitmask<slang::ast::IntegralFlags>::bitmask(local_59,Signed);
      in_stack_ffffffffffffff30 =
           Compilation::getType
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffd7)
      ;
      local_28.previewNode = (SyntaxNode *)in_stack_ffffffffffffff30;
      goto LAB_00babc29;
    }
  }
  SVInt::resize(in_stack_ffffffffffffff18,(bitwidth_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  SVInt::operator=((SVInt *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  SVInt::~SVInt(in_stack_ffffffffffffff10);
  SVInt::setSigned((SVInt *)&local_28,true);
  local_28.previewNode = (SyntaxNode *)Compilation::getIntType(local_8);
LAB_00babc29:
  args_4 = (Type *)local_28.previewNode;
  SVar5 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff50);
  pIVar4 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
                     ((BumpAllocator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                      ,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(SVInt *)SVar5.startLoc,
                      (bool *)SVar5.endLoc,(SourceRange *)args_4);
  SVInt::~SVInt((SVInt *)local_8);
  return &pIVar4->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromSyntax(Compilation& comp, const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::IntegerLiteralExpression);

    const Type* type;
    SVInt val = syntax.literal.intValue();
    if (val.getBitWidth() < 32 || comp.languageVersion() < LanguageVersion::v1800_2023) {
        // In v2023 the rule changed to not truncate unsized literals.
        // Literals smaller than 32 bits are always sized up to 32.
        val = val.resize(32);
        val.setSigned(true);
        type = &comp.getIntType();
    }
    else {
        if (!val.isSigned()) {
            // Note the +1 here to account for the sign bit we're going to add.
            val = val.resize(val.getBitWidth() + 1);
            val.setSigned(true);
        }
        type = &comp.getType(val.getBitWidth(), IntegralFlags::Signed);
    }

    return *comp.emplace<IntegerLiteral>(comp, *type, std::move(val), true, syntax.sourceRange());
}